

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

int llvm::APInt::tcMultiplyPart
              (WordType *dst,WordType *src,WordType multiplier,WordType carry,uint srcParts,
              uint dstParts,bool add)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  
  if (dst < src + srcParts && src < dst) {
    __assert_fail("dst <= src || dst >= src + srcParts",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x957,
                  "static int llvm::APInt::tcMultiplyPart(WordType *, const WordType *, WordType, WordType, unsigned int, unsigned int, bool)"
                 );
  }
  if (dstParts <= srcParts + 1) {
    uVar5 = dstParts;
    if (srcParts < dstParts) {
      uVar5 = srcParts;
    }
    if (uVar5 != 0) {
      uVar8 = 0;
      do {
        if ((multiplier == 0) || (uVar1 = src[uVar8], uVar1 == 0)) {
          uVar3 = carry;
          carry = 0;
        }
        else {
          uVar2 = (uVar1 & 0xffffffff) * (multiplier & 0xffffffff);
          uVar6 = (uVar1 & 0xffffffff) * (multiplier >> 0x20);
          uVar9 = (uVar1 >> 0x20) * (multiplier & 0xffffffff);
          uVar7 = ((ulong)(uint)((int)uVar6 + (int)uVar9) << 0x20) + uVar2;
          uVar3 = carry + uVar7;
          carry = (ulong)(uVar7 < (uVar6 << 0x20) + uVar2) +
                  (uVar9 >> 0x20) + (uVar6 >> 0x20) + (uVar1 >> 0x20) * (multiplier >> 0x20) +
                  (ulong)CARRY8(uVar6 << 0x20,uVar2) + (ulong)CARRY8(carry,uVar7);
        }
        if (add) {
          bVar10 = CARRY8(uVar3,dst[uVar8]);
          uVar3 = uVar3 + dst[uVar8];
          carry = carry + bVar10;
        }
        dst[uVar8] = uVar3;
        uVar8 = uVar8 + 1;
      } while (uVar5 != uVar8);
    }
    if (srcParts < dstParts) {
      if (srcParts + 1 != dstParts) {
        __assert_fail("srcParts + 1 == dstParts",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                      ,0x992,
                      "static int llvm::APInt::tcMultiplyPart(WordType *, const WordType *, WordType, WordType, unsigned int, unsigned int, bool)"
                     );
      }
      dst[srcParts] = carry;
    }
    else {
      if (carry != 0) {
        return 1;
      }
      if (dstParts < srcParts && multiplier != 0) {
        lVar4 = 0;
        do {
          if (src[(ulong)dstParts + lVar4] != 0) {
            return 1;
          }
          lVar4 = lVar4 + 1;
        } while (srcParts - dstParts != (int)lVar4);
      }
    }
    return 0;
  }
  __assert_fail("dstParts <= srcParts + 1",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                ,0x958,
                "static int llvm::APInt::tcMultiplyPart(WordType *, const WordType *, WordType, WordType, unsigned int, unsigned int, bool)"
               );
}

Assistant:

int APInt::tcMultiplyPart(WordType *dst, const WordType *src,
                          WordType multiplier, WordType carry,
                          unsigned srcParts, unsigned dstParts,
                          bool add) {
  /* Otherwise our writes of DST kill our later reads of SRC.  */
  assert(dst <= src || dst >= src + srcParts);
  assert(dstParts <= srcParts + 1);

  /* N loops; minimum of dstParts and srcParts.  */
  unsigned n = std::min(dstParts, srcParts);

  for (unsigned i = 0; i < n; i++) {
    WordType low, mid, high, srcPart;

      /* [ LOW, HIGH ] = MULTIPLIER * SRC[i] + DST[i] + CARRY.

         This cannot overflow, because

         (n - 1) * (n - 1) + 2 (n - 1) = (n - 1) * (n + 1)

         which is less than n^2.  */

    srcPart = src[i];

    if (multiplier == 0 || srcPart == 0) {
      low = carry;
      high = 0;
    } else {
      low = lowHalf(srcPart) * lowHalf(multiplier);
      high = highHalf(srcPart) * highHalf(multiplier);

      mid = lowHalf(srcPart) * highHalf(multiplier);
      high += highHalf(mid);
      mid <<= APINT_BITS_PER_WORD / 2;
      if (low + mid < low)
        high++;
      low += mid;

      mid = highHalf(srcPart) * lowHalf(multiplier);
      high += highHalf(mid);
      mid <<= APINT_BITS_PER_WORD / 2;
      if (low + mid < low)
        high++;
      low += mid;

      /* Now add carry.  */
      if (low + carry < low)
        high++;
      low += carry;
    }

    if (add) {
      /* And now DST[i], and store the new low part there.  */
      if (low + dst[i] < low)
        high++;
      dst[i] += low;
    } else
      dst[i] = low;

    carry = high;
  }

  if (srcParts < dstParts) {
    /* Full multiplication, there is no overflow.  */
    assert(srcParts + 1 == dstParts);
    dst[srcParts] = carry;
    return 0;
  }

  /* We overflowed if there is carry.  */
  if (carry)
    return 1;

  /* We would overflow if any significant unwritten parts would be
     non-zero.  This is true if any remaining src parts are non-zero
     and the multiplier is non-zero.  */
  if (multiplier)
    for (unsigned i = dstParts; i < srcParts; i++)
      if (src[i])
        return 1;

  /* We fitted in the narrow destination.  */
  return 0;
}